

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ini.hpp
# Opt level: O1

vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *
CLI::detail::parse_ini
          (vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
           *__return_storage_ptr__,string *name)

{
  pointer pcVar1;
  FileError *__return_storage_ptr___00;
  ifstream input;
  string local_248;
  long local_228 [4];
  int aiStack_208 [122];
  
  ::std::ifstream::ifstream(local_228,(string *)name,_S_in);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228[0] + -0x18)) == 0) {
    parse_ini(__return_storage_ptr__,(istream *)local_228);
    ::std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (FileError *)__cxa_allocate_exception(0x38);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar1,pcVar1 + name->_M_string_length);
  FileError::Missing(__return_storage_ptr___00,&local_248);
  __cxa_throw(__return_storage_ptr___00,&FileError::typeinfo,Error::~Error);
}

Assistant:

inline std::vector<ini_ret_t> parse_ini(const std::string &name) {

    std::ifstream input{name};
    if(!input.good())
        throw FileError::Missing(name);

    return parse_ini(input);
}